

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O1

SQInteger __thiscall SQLexer::AddUTF8(SQLexer *this,SQUnsignedInteger ch)

{
  sqvector<char> *psVar1;
  ulong uVar2;
  char *pcVar3;
  byte bVar4;
  ulong uVar5;
  SQUnsignedInteger SVar6;
  SQUnsignedInteger *pSVar7;
  SQUnsignedInteger *pSVar8;
  SQInteger SVar9;
  SQUnsignedInteger SVar10;
  SQUnsignedInteger SVar11;
  
  if (ch < 0x80) {
    uVar2 = (this->_longstr)._size;
    uVar5 = (this->_longstr)._allocated;
    SVar9 = 1;
    if (uVar2 < uVar5) goto LAB_001528ff;
  }
  else {
    bVar4 = (byte)ch;
    if (ch < 0x800) {
      psVar1 = &this->_longstr;
      pSVar8 = &(this->_longstr)._allocated;
      uVar5 = (this->_longstr)._size;
      SVar6 = (this->_longstr)._allocated;
      pSVar7 = &(this->_longstr)._size;
      if (SVar6 <= uVar5) {
        SVar11 = uVar5 * 2;
        SVar10 = 4;
        if (SVar11 != 0) {
          SVar10 = SVar11;
        }
        pcVar3 = (char *)sq_vm_realloc(psVar1->_vals,SVar6,SVar10);
        psVar1->_vals = pcVar3;
        *pSVar8 = SVar10;
      }
      SVar6 = *pSVar7;
      *pSVar7 = SVar6 + 1;
      psVar1->_vals[SVar6] = (byte)(ch >> 6) | 0xc0;
      ch = (SQUnsignedInteger)(bVar4 & 0x3f | 0x80);
      uVar5 = *pSVar8;
      uVar2 = *pSVar7;
      SVar9 = 2;
    }
    else if (ch < 0x10000) {
      psVar1 = &this->_longstr;
      pSVar8 = &(this->_longstr)._allocated;
      uVar5 = (this->_longstr)._size;
      SVar6 = (this->_longstr)._allocated;
      pSVar7 = &(this->_longstr)._size;
      if (SVar6 <= uVar5) {
        SVar11 = uVar5 * 2;
        SVar10 = 4;
        if (SVar11 != 0) {
          SVar10 = SVar11;
        }
        pcVar3 = (char *)sq_vm_realloc(psVar1->_vals,SVar6,SVar10);
        psVar1->_vals = pcVar3;
        *pSVar8 = SVar10;
      }
      SVar6 = *pSVar7;
      *pSVar7 = SVar6 + 1;
      psVar1->_vals[SVar6] = (byte)(ch >> 0xc) | 0xe0;
      if (*pSVar8 <= *pSVar7) {
        SVar6 = *pSVar7 * 2;
        SVar11 = 4;
        if (SVar6 != 0) {
          SVar11 = SVar6;
        }
        pcVar3 = (char *)sq_vm_realloc(psVar1->_vals,*pSVar8,SVar11);
        psVar1->_vals = pcVar3;
        *pSVar8 = SVar11;
      }
      SVar6 = *pSVar7;
      *pSVar7 = SVar6 + 1;
      psVar1->_vals[SVar6] = (byte)(ch >> 6) & 0x3f | 0x80;
      ch = (SQUnsignedInteger)(bVar4 & 0x3f | 0x80);
      uVar5 = *pSVar8;
      uVar2 = *pSVar7;
      SVar9 = 3;
    }
    else {
      if ("QNativeClosure7ReleaseEv" < ch) {
        return 0;
      }
      psVar1 = &this->_longstr;
      pSVar8 = &(this->_longstr)._allocated;
      uVar5 = (this->_longstr)._size;
      SVar6 = (this->_longstr)._allocated;
      pSVar7 = &(this->_longstr)._size;
      if (SVar6 <= uVar5) {
        SVar11 = uVar5 * 2;
        SVar10 = 4;
        if (SVar11 != 0) {
          SVar10 = SVar11;
        }
        pcVar3 = (char *)sq_vm_realloc(psVar1->_vals,SVar6,SVar10);
        psVar1->_vals = pcVar3;
        *pSVar8 = SVar10;
      }
      SVar6 = *pSVar7;
      *pSVar7 = SVar6 + 1;
      psVar1->_vals[SVar6] = (byte)(ch >> 0x12) | 0xf0;
      if (*pSVar8 <= *pSVar7) {
        SVar6 = *pSVar7 * 2;
        SVar11 = 4;
        if (SVar6 != 0) {
          SVar11 = SVar6;
        }
        pcVar3 = (char *)sq_vm_realloc(psVar1->_vals,*pSVar8,SVar11);
        psVar1->_vals = pcVar3;
        *pSVar8 = SVar11;
      }
      SVar6 = *pSVar7;
      *pSVar7 = SVar6 + 1;
      psVar1->_vals[SVar6] = (byte)(ch >> 0xc) & 0x3f | 0x80;
      if (*pSVar8 <= *pSVar7) {
        SVar6 = *pSVar7 * 2;
        SVar11 = 4;
        if (SVar6 != 0) {
          SVar11 = SVar6;
        }
        pcVar3 = (char *)sq_vm_realloc(psVar1->_vals,*pSVar8,SVar11);
        psVar1->_vals = pcVar3;
        *pSVar8 = SVar11;
      }
      SVar6 = *pSVar7;
      *pSVar7 = SVar6 + 1;
      psVar1->_vals[SVar6] = (byte)(ch >> 6) & 0x3f | 0x80;
      ch = (SQUnsignedInteger)(bVar4 & 0x3f | 0x80);
      uVar5 = *pSVar8;
      uVar2 = *pSVar7;
      SVar9 = 4;
    }
    if (uVar2 < uVar5) goto LAB_001528ff;
  }
  SVar6 = 4;
  if (uVar2 * 2 != 0) {
    SVar6 = uVar2 * 2;
  }
  pcVar3 = (char *)sq_vm_realloc((this->_longstr)._vals,uVar5,SVar6);
  (this->_longstr)._vals = pcVar3;
  (this->_longstr)._allocated = SVar6;
LAB_001528ff:
  pSVar8 = &(this->_longstr)._size;
  SVar6 = *pSVar8;
  *pSVar8 = SVar6 + 1;
  (this->_longstr)._vals[SVar6] = (char)ch;
  return SVar9;
}

Assistant:

SQInteger SQLexer::AddUTF8(SQUnsignedInteger ch)
{
    if (ch < 0x80) {
        APPEND_CHAR((char)ch);
        return 1;
    }
    if (ch < 0x800) {
        APPEND_CHAR((SQChar)((ch >> 6) | 0xC0));
        APPEND_CHAR((SQChar)((ch & 0x3F) | 0x80));
        return 2;
    }
    if (ch < 0x10000) {
        APPEND_CHAR((SQChar)((ch >> 12) | 0xE0));
        APPEND_CHAR((SQChar)(((ch >> 6) & 0x3F) | 0x80));
        APPEND_CHAR((SQChar)((ch & 0x3F) | 0x80));
        return 3;
    }
    if (ch < 0x110000) {
        APPEND_CHAR((SQChar)((ch >> 18) | 0xF0));
        APPEND_CHAR((SQChar)(((ch >> 12) & 0x3F) | 0x80));
        APPEND_CHAR((SQChar)(((ch >> 6) & 0x3F) | 0x80));
        APPEND_CHAR((SQChar)((ch & 0x3F) | 0x80));
        return 4;
    }
    return 0;
}